

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.cpp
# Opt level: O1

BasicBlock * __thiscall
spvtools::opt::InvocationInterlockPlacementPass::splitEdge
          (InvocationInterlockPlacementPass *this,BasicBlock *block,uint32_t succ_id)

{
  Instruction *pIVar1;
  pointer pOVar2;
  uint **ppuVar3;
  undefined8 uVar4;
  bool bVar5;
  char cVar6;
  BasicBlock *pBVar7;
  uint **ppuVar8;
  pointer pOVar9;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
  new_succ_temp;
  uint local_c4;
  Op local_c0 [2];
  undefined1 local_b8 [40];
  __uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_90;
  __uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_> local_88;
  _Any_data local_80;
  initializer_list<spvtools::opt::Operand> local_70;
  Instruction *local_60;
  undefined1 local_58 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_38;
  
  local_70._M_array = (iterator)(this->super_Pass).context_;
  local_88._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>.
  super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl._0_4_ = 0xf8;
  local_c0[0] = OpNop;
  local_c4 = Pass::TakeNextId(&this->super_Pass);
  local_b8._0_8_ = (iterator)0x0;
  local_b8._8_8_ = (_func_int **)0x0;
  MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int,std::initializer_list<spvtools::opt::Operand>>
            ((spvtools *)local_58,(IRContext **)&local_70,(Op *)&local_88,(int *)local_c0,&local_c4,
             (initializer_list<spvtools::opt::Operand> *)local_b8);
  pBVar7 = (BasicBlock *)operator_new(0x88);
  uVar4 = local_58._0_8_;
  local_58._0_8_ = (_func_int **)0x0;
  pBVar7->function_ = (Function *)0x0;
  (pBVar7->label_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl = (Instruction *)uVar4;
  local_80._8_8_ = &pBVar7->insts_;
  pIVar1 = &(pBVar7->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
  (pBVar7->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = (Instruction *)0x0;
  (pBVar7->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ = (Instruction *)0x0;
  (pBVar7->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>._vptr_IntrusiveNodeBase =
       (_func_int **)&PTR__Instruction_003e9ae0;
  (pBVar7->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.unique_id_ = 0;
  (pBVar7->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.context_ =
       (IRContext *)0x0;
  *(undefined8 *)
   ((long)&(pBVar7->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.context_ + 6)
       = 0;
  (pBVar7->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.operands_.
  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(pBVar7->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.operands_.
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(pBVar7->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.operands_.
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (pBVar7->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.dbg_line_insts_.
  super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(pBVar7->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           dbg_line_insts_.
           super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(pBVar7->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           dbg_line_insts_.
           super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (pBVar7->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.dbg_scope_.
  lexical_scope_ = 0;
  (pBVar7->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.dbg_scope_.inlined_at_
       = 0;
  (pBVar7->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_ = pIVar1;
  (pBVar7->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_ = pIVar1;
  (pBVar7->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
  super_IntrusiveNodeBase<spvtools::opt::Instruction>.is_sentinel_ = true;
  (pBVar7->insts_).super_IntrusiveList<spvtools::opt::Instruction>._vptr_IntrusiveList =
       (_func_int **)&PTR__InstructionList_003e9b78;
  local_80._M_unused._0_8_ = (undefined8)pBVar7;
  Function::InsertBasicBlockAfter
            (block->function_,
             (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
              *)&local_80,block);
  local_88._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>.
  super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl =
       (tuple<spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>)
       (this->super_Pass).context_;
  local_c0[0] = OpBranch;
  local_c4 = 0;
  local_c0[1] = 0;
  local_58._0_8_ = &PTR__SmallVector_003e9b28;
  local_58._24_8_ = local_58 + 0x10;
  local_38._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_58._8_8_ = 1;
  local_b8._0_4_ = 1;
  local_b8._8_8_ = &PTR__SmallVector_003e9b28;
  local_b8._16_8_ = 0;
  local_b8._32_8_ = local_b8 + 0x18;
  local_90._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  local_58._16_4_ = succ_id;
  utils::SmallVector<unsigned_int,_2UL>::operator=
            ((SmallVector<unsigned_int,_2UL> *)(local_b8 + 8),
             (SmallVector<unsigned_int,_2UL> *)local_58);
  local_70._M_len = 1;
  local_70._M_array = (iterator)local_b8;
  MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
            ((spvtools *)&local_60,(IRContext **)&local_88,local_c0,(int *)&local_c4,
             (int *)(local_c0 + 1),&local_70);
  pIVar1 = local_60;
  local_60 = (Instruction *)0x0;
  utils::IntrusiveList<spvtools::opt::Instruction>::push_back
            ((IntrusiveList<spvtools::opt::Instruction> *)local_80._8_8_,pIVar1);
  if (local_60 != (Instruction *)0x0) {
    (**(code **)(*(long *)local_60 + 8))();
  }
  local_60 = (Instruction *)0x0;
  local_b8._8_8_ = &PTR__SmallVector_003e9b28;
  if (local_90._M_t.
      super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
      _M_head_impl !=
      (_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
       )0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_90,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               local_90._M_t.
               super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               .
               super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
               ._M_head_impl);
  }
  local_90._M_t.
  super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  .super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>.
  _M_head_impl = (tuple<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  )(_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )0x0;
  local_58._0_8_ = &PTR__SmallVector_003e9b28;
  if (local_38._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
              ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
               &local_38,local_38._M_head_impl);
  }
  pIVar1 = (block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  if ((pIVar1 == (Instruction *)0x0) ||
     ((pIVar1->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false)) {
    __assert_fail("!insts_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h"
                  ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
  }
  pIVar1 = (block->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
           super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_;
  if ((pIVar1->opcode_ & ~OpUndef) != OpBranchConditional) {
    __assert_fail("block->tail()->opcode() == spv::Op::OpBranchConditional || block->tail()->opcode() == spv::Op::OpSwitch"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp"
                  ,0x137,
                  "BasicBlock *spvtools::opt::InvocationInterlockPlacementPass::splitEdge(BasicBlock *, uint32_t)"
                 );
  }
  local_b8._12_4_ = 0;
  local_b8._8_4_ = succ_id;
  local_b8._24_8_ =
       std::
       _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp:317:32)>
       ::_M_invoke;
  local_b8._16_8_ =
       std::
       _Function_handler<bool_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp:317:32)>
       ::_M_manager;
  pOVar9 = (pIVar1->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pOVar2 = (pIVar1->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_b8._0_8_ = pBVar7;
  if (pOVar9 != pOVar2) {
    do {
      bVar5 = spvIsInIdType(pOVar9->type);
      if (bVar5) {
        ppuVar3 = (uint **)(pOVar9->words).large_data_._M_t.
                           super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           .
                           super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                           ._M_head_impl;
        ppuVar8 = &(pOVar9->words).small_data_;
        if (ppuVar3 != (uint **)0x0) {
          ppuVar8 = ppuVar3;
        }
        local_58._0_8_ = *ppuVar8;
        if ((code *)local_b8._16_8_ == (code *)0x0) {
          std::__throw_bad_function_call();
        }
        cVar6 = (*(code *)local_b8._24_8_)(local_b8,local_58);
        if (cVar6 == '\0') break;
      }
      pOVar9 = pOVar9 + 1;
    } while (pOVar9 != pOVar2);
  }
  if ((code *)local_b8._16_8_ != (code *)0x0) {
    (*(code *)local_b8._16_8_)(local_b8,local_b8,3);
  }
  if ((BasicBlock *)local_80._M_unused._0_8_ != (BasicBlock *)0x0) {
    std::default_delete<spvtools::opt::BasicBlock>::operator()
              ((default_delete<spvtools::opt::BasicBlock> *)local_80._M_pod_data,
               (BasicBlock *)local_80._M_unused._0_8_);
  }
  return pBVar7;
}

Assistant:

BasicBlock* InvocationInterlockPlacementPass::splitEdge(BasicBlock* block,
                                                        uint32_t succ_id) {
  // Create a new block to replace the critical edge.
  auto new_succ_temp = MakeUnique<BasicBlock>(
      MakeUnique<Instruction>(context(), spv::Op::OpLabel, 0, TakeNextId(),
                              std::initializer_list<Operand>{}));
  auto* new_succ = new_succ_temp.get();

  // Insert the new block into the function.
  block->GetParent()->InsertBasicBlockAfter(std::move(new_succ_temp), block);

  new_succ->AddInstruction(MakeUnique<Instruction>(
      context(), spv::Op::OpBranch, 0, 0,
      std::initializer_list<Operand>{
          Operand(spv_operand_type_t::SPV_OPERAND_TYPE_ID, {succ_id})}));

  assert(block->tail()->opcode() == spv::Op::OpBranchConditional ||
         block->tail()->opcode() == spv::Op::OpSwitch);

  // Update the first branch to successor to instead branch to
  // the new successor. If there are multiple edges, we arbitrarily choose the
  // first time it appears in the list. The other edges to `succ_id` will have
  // to be split by another call to `splitEdge`.
  block->tail()->WhileEachInId([new_succ, succ_id](uint32_t* branch_id) {
    if (*branch_id == succ_id) {
      *branch_id = new_succ->id();
      return false;
    }
    return true;
  });

  return new_succ;
}